

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

ItemSimilarityRecommender_ConnectedItem * __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::New
          (ItemSimilarityRecommender_ConnectedItem *this,Arena *arena)

{
  ItemSimilarityRecommender_ConnectedItem *this_00;
  
  this_00 = (ItemSimilarityRecommender_ConnectedItem *)operator_new(0x28);
  ItemSimilarityRecommender_ConnectedItem(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

ItemSimilarityRecommender_ConnectedItem* ItemSimilarityRecommender_ConnectedItem::New(::google::protobuf::Arena* arena) const {
  ItemSimilarityRecommender_ConnectedItem* n = new ItemSimilarityRecommender_ConnectedItem;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}